

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O3

void __thiscall GibbsSamplerFromHDP::countN(GibbsSamplerFromHDP *this)

{
  pointer puVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer puVar10;
  pointer puVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  
  fillMatrix<unsigned_int>(&this->_njt,0);
  fillTensor<unsigned_int>(&this->_njtv,0);
  uVar12 = this->_J;
  if (uVar12 != 0) {
    puVar1 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (this->_xji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->_tji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this->_njtv).
             super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      if (puVar1[uVar13] != 0) {
        lVar5 = *(long *)&pvVar3[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        lVar6 = *(long *)&pvVar2[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        lVar7 = *(long *)&pvVar4[uVar13].
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        uVar16 = 0;
        do {
          piVar14 = (int *)(*(long *)(lVar7 + (ulong)*(uint *)(lVar5 + uVar16 * 4) * 0x18) +
                           (ulong)*(uint *)(lVar6 + uVar16 * 4) * 4);
          *piVar14 = *piVar14 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar16 < puVar1[uVar13]);
        uVar12 = this->_J;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar12);
    if (uVar12 != 0) {
      puVar1 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar2 = (this->_njt).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (this->_njtv).
               super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        if (puVar1[uVar13] != 0) {
          lVar5 = *(long *)&pvVar4[uVar13].
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          lVar6 = *(long *)&pvVar2[uVar13].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data;
          uVar16 = 0;
          do {
            iVar15 = 0;
            for (piVar14 = *(int **)(lVar5 + uVar16 * 0x18);
                piVar14 != *(int **)(lVar5 + 8 + uVar16 * 0x18); piVar14 = piVar14 + 1) {
              iVar15 = iVar15 + *piVar14;
            }
            *(int *)(lVar6 + uVar16 * 4) = iVar15;
            uVar16 = uVar16 + 1;
          } while (uVar16 < puVar1[uVar13]);
          uVar12 = this->_J;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar12);
    }
  }
  puVar1 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar11 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar1 != puVar11) {
    memset(puVar1,0,((long)puVar11 + (-4 - (long)puVar1) & 0xfffffffffffffffcU) + 4);
  }
  fillMatrix<unsigned_int>(&this->_nkv,0);
  uVar12 = this->_J;
  if (uVar12 != 0) {
    puVar1 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (this->_xji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->_tji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->_nkv).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      if (puVar1[uVar13] != 0) {
        lVar5 = *(long *)&pvVar3[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        lVar6 = *(long *)&pvVar8[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        lVar7 = *(long *)&pvVar2[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        uVar16 = 0;
        do {
          piVar14 = (int *)(*(long *)&pvVar9[*(uint *)(lVar6 + (ulong)*(uint *)(lVar5 + uVar16 * 4)
                                                               * 4)].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data +
                           (ulong)*(uint *)(lVar7 + uVar16 * 4) * 4);
          *piVar14 = *piVar14 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar16 < puVar1[uVar13]);
        uVar12 = this->_J;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar12);
  }
  if (this->_K != 0) {
    puVar1 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (this->_nkv).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      puVar11 = pvVar2[uVar13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar10 = *(pointer *)
                 ((long)&pvVar2[uVar13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8);
      uVar12 = 0;
      if (puVar11 != puVar10) {
        uVar12 = 0;
        do {
          uVar12 = uVar12 + *puVar11;
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar10);
      }
      puVar1[uVar13] = uVar12;
      uVar13 = uVar13 + 1;
    } while (uVar13 < this->_K);
  }
  puVar1 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar11 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar1 != puVar11) {
    memset(puVar1,0,((long)puVar11 + (-4 - (long)puVar1) & 0xfffffffffffffffcU) + 4);
  }
  uVar12 = this->_J;
  if (uVar12 != 0) {
    puVar11 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar2 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      if (puVar11[uVar13] != 0) {
        lVar5 = *(long *)&pvVar2[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        uVar16 = 0;
        do {
          puVar1[*(uint *)(lVar5 + uVar16 * 4)] = puVar1[*(uint *)(lVar5 + uVar16 * 4)] + 1;
          uVar16 = uVar16 + 1;
        } while (uVar16 < puVar11[uVar13]);
        uVar12 = this->_J;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar12);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::countN(){//{{{
    // count njt from tji
    fillMatrix(_njt, 0u);
    fillTensor(_njtv, 0u);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            unsigned int t = _tji[j][i];
            unsigned int v = _xji[j][i];
            _njtv[j][t][v]++;
        }
    }
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _njt[j][t] = accumulate(_njtv[j][t].begin(), _njtv[j][t].end(), 0u);
        }
    }
    // delete t & update tji
    // count njt from tji
    fill(_nk.begin(), _nk.end(), 0);
    // count nkv from kjtji & xji
    fillMatrix(_nkv, 0u);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            unsigned int t = _tji[j][i];
            unsigned int k = _kjt[j][t];
            unsigned int v = _xji[j][i];
            _nkv[k][v]++;
        }
    }
    for(int k=0; k<_K; k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0u);
    }
    fill(_mk.begin(), _mk.end(), 0);
    // mk
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _mk[_kjt[j][t]]++;
        }
    }
}